

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.cpp
# Opt level: O0

bool __thiscall Rml::Template::Load(Template *this,Stream *stream)

{
  undefined8 uVar1;
  bool bVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  char *string;
  char *pcVar6;
  char *string_00;
  pointer pSVar7;
  URL *pUVar8;
  DocumentHeader *pDVar9;
  unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> local_200;
  undefined1 local_1f8 [8];
  XMLParser parser;
  char *local_d0;
  unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> local_c8;
  UniquePtr<Rml::StreamMemory> header_stream;
  char *ptr;
  String attribute_value;
  String attribute_name;
  char *body_end;
  char *body_start;
  char *head_end;
  char *head_start;
  string local_40 [8];
  String buffer;
  Stream *stream_local;
  Template *this_local;
  
  buffer.field_2._8_8_ = stream;
  ::std::__cxx11::string::string(local_40);
  uVar1 = buffer.field_2._8_8_;
  uVar3 = (**(code **)(*(long *)buffer.field_2._8_8_ + 0x20))();
  (**(code **)(*(long *)uVar1 + 0x48))(uVar1,local_40,uVar3);
  pcVar4 = (char *)::std::__cxx11::string::c_str();
  pcVar4 = XMLParseTools::FindTag("head",pcVar4,false);
  if (pcVar4 == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pcVar5 = XMLParseTools::FindTag("head",pcVar4,true);
    if (pcVar5 == (char *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      pcVar5 = strchr(pcVar5,0x3e);
      string = XMLParseTools::FindTag("body",pcVar5 + 1,false);
      if (string == (char *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        pcVar6 = XMLParseTools::FindTag("body",string,true);
        if (pcVar6 == (char *)0x0) {
          this_local._7_1_ = false;
        }
        else {
          pcVar6 = strchr(pcVar6,0x3e);
          ::std::__cxx11::string::string((string *)(attribute_value.field_2._M_local_buf + 8));
          ::std::__cxx11::string::string((string *)&ptr);
          string_00 = (char *)::std::__cxx11::string::c_str();
          header_stream._M_t.
          super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>._M_t.
          super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
          super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl =
               (__uniq_ptr_data<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>,_true,_true>
                )XMLParseTools::FindTag("template",string_00,false);
          if ((tuple<Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>)
              header_stream._M_t.
              super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>._M_t
              .super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
              super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl ==
              (_Head_base<0UL,_Rml::StreamMemory_*,_false>)0x0) {
            this_local._7_1_ = false;
            header_stream._M_t.
            super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>._M_t.
            super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
            super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl =
                 (__uniq_ptr_data<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>,_true,_true>
                  )(__uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>)0x0;
          }
          else {
            while( true ) {
              header_stream._M_t.
              super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>._M_t
              .super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
              super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl =
                   (__uniq_ptr_data<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>,_true,_true>
                    )((long)header_stream._M_t.
                            super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>
                            .super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl + 1);
              bVar2 = XMLParseTools::ReadAttribute
                                ((char **)&header_stream,
                                 (String *)((long)&attribute_value.field_2 + 8),(String *)&ptr);
              if (!bVar2) break;
              bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&attribute_value.field_2 + 8),"name");
              if (bVar2) {
                ::std::__cxx11::string::operator=((string *)this,(string *)&ptr);
              }
              bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&attribute_value.field_2 + 8),"content");
              if (bVar2) {
                ::std::__cxx11::string::operator=((string *)&this->content,(string *)&ptr);
              }
            }
            parser.stack.c.
            super__Deque_base<Rml::XMLParser::ParseFrame,_std::allocator<Rml::XMLParser::ParseFrame>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)(pcVar5 + 1 + -(long)pcVar4);
            local_d0 = pcVar4;
            MakeUnique<Rml::StreamMemory,unsigned_char_const*,long>
                      ((uchar **)&local_c8,(long *)&local_d0);
            pSVar7 = ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::
                     operator->(&local_c8);
            pUVar8 = Stream::GetSourceURL((Stream *)buffer.field_2._8_8_);
            StreamMemory::SetSourceURL(pSVar7,pUVar8);
            XMLParser::XMLParser((XMLParser *)local_1f8,(Element *)0x0);
            pSVar7 = ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::
                     get(&local_c8);
            BaseXMLParser::Parse((BaseXMLParser *)local_1f8,&pSVar7->super_Stream);
            ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::reset
                      (&local_c8,(pointer)0x0);
            pDVar9 = XMLParser::GetDocumentHeader((XMLParser *)local_1f8);
            DocumentHeader::operator=(&this->header,pDVar9);
            MakeUnique<Rml::StreamMemory,long>((long *)&local_200);
            ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::operator=
                      (&this->body,&local_200);
            ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::
            ~unique_ptr(&local_200);
            pSVar7 = ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::
                     operator->(&this->body);
            pUVar8 = Stream::GetSourceURL((Stream *)buffer.field_2._8_8_);
            StreamMemory::SetSourceURL(pSVar7,pUVar8);
            pSVar7 = ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::
                     operator->(&this->body);
            Stream::PushBack(&pSVar7->super_Stream,string,(size_t)(pcVar6 + (1 - (long)string)));
            this_local._7_1_ = true;
            XMLParser::~XMLParser((XMLParser *)local_1f8);
            ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::
            ~unique_ptr(&local_c8);
          }
          ::std::__cxx11::string::~string((string *)&ptr);
          ::std::__cxx11::string::~string((string *)(attribute_value.field_2._M_local_buf + 8));
        }
      }
    }
  }
  ::std::__cxx11::string::~string(local_40);
  return this_local._7_1_;
}

Assistant:

bool Template::Load(Stream* stream)
{
	// Load the entire template into memory so we can pull out
	// the header and body tags
	String buffer;
	stream->Read(buffer, stream->Length());

	// Pull out the header
	const char* head_start = XMLParseTools::FindTag("head", buffer.c_str());
	if (!head_start)
		return false;

	const char* head_end = XMLParseTools::FindTag("head", head_start, true);
	if (!head_end)
		return false;
	// Advance to the end of the tag
	head_end = strchr(head_end, '>') + 1;

	// Pull out the body
	const char* body_start = XMLParseTools::FindTag("body", head_end);
	if (!body_start)
		return false;

	const char* body_end = XMLParseTools::FindTag("body", body_start, true);
	if (!body_end)
		return false;
	// Advance to the end of the tag
	body_end = strchr(body_end, '>') + 1;

	// Find the RML tag, skip over it and read the attributes,
	// storing the ones we're interested in.
	String attribute_name;
	String attribute_value;
	const char* ptr = XMLParseTools::FindTag("template", buffer.c_str());
	if (!ptr)
		return false;

	while (XMLParseTools::ReadAttribute(++ptr, attribute_name, attribute_value))
	{
		if (attribute_name == "name")
			name = attribute_value;
		if (attribute_name == "content")
			content = attribute_value;
	}

	// Create a stream around the header, parse it and store it
	auto header_stream = MakeUnique<StreamMemory>((const byte*)head_start, head_end - head_start);
	header_stream->SetSourceURL(stream->GetSourceURL());

	XMLParser parser(nullptr);
	parser.Parse(header_stream.get());

	header_stream.reset();

	header = *parser.GetDocumentHeader();

	// Store the body in stream form
	body = MakeUnique<StreamMemory>(body_end - body_start);
	body->SetSourceURL(stream->GetSourceURL());
	body->PushBack(body_start, body_end - body_start);

	return true;
}